

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t process_extra(archive_read *a,archive_entry *entry,char *p,size_t extra_length,
                     zip_entry *zip_entry)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  void *pvVar4;
  code *pcVar5;
  uint uVar6;
  size_t sVar7;
  archive_string_conv *paVar8;
  size_t sVar9;
  ulong uVar10;
  ushort uVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  wchar_t wVar18;
  uint uVar19;
  
  if (extra_length == 0) {
    wVar18 = L'\0';
  }
  else if (extra_length < 4) {
    sVar7 = 0;
    do {
      if (extra_length == sVar7) {
        return L'\0';
      }
      pcVar13 = p + sVar7;
      sVar7 = sVar7 + 1;
    } while (*pcVar13 == '\0');
    archive_set_error(&a->archive,0x54,
                      "Too-small extra data: Need at least 4 bytes, but only found %d bytes",
                      extra_length & 0xffffffff);
LAB_0010b277:
    wVar18 = L'\xffffffe7';
  }
  else {
    pvVar4 = a->format->data;
    uVar6 = 0;
    while( true ) {
      wVar18 = L'\0';
      uVar10 = (ulong)uVar6;
      if (extra_length - 4 < uVar10) break;
      uVar11 = *(ushort *)(p + uVar10 + 2);
      uVar15 = (uint)uVar11;
      uVar19 = uVar6 + 4;
      if (extra_length < uVar6 + uVar11 + 4) {
        archive_set_error(&a->archive,0x54,
                          "Extra data overflow: Need %d bytes but only found %d bytes",(ulong)uVar11
                          ,(ulong)((int)extra_length - uVar19));
        goto LAB_0010b277;
      }
      sVar3 = *(short *)(p + uVar10);
      uVar10 = (ulong)uVar19;
      if (sVar3 == -0x66ff) {
        if (uVar11 < 6) {
          pcVar13 = "Incomplete AES field";
LAB_0010b26d:
          archive_set_error(&a->archive,0x54,pcVar13);
          goto LAB_0010b277;
        }
        if ((p[uVar6 + 6] == 'A') && (p[uVar6 + 7] == 'E')) {
          (zip_entry->aes_extra).vendor = (uint)*(ushort *)(p + uVar10);
          (zip_entry->aes_extra).strength = (int)p[uVar6 + 8];
          (zip_entry->aes_extra).compression = p[uVar6 + 9];
        }
      }
      else {
        uVar14 = (uint)uVar11;
        if (sVar3 == 0x5455) {
          if (uVar11 == 0) {
            pcVar13 = "Incomplete extended time field";
            goto LAB_0010b26d;
          }
          bVar1 = p[uVar10];
          uVar19 = uVar6 + 5;
          uVar15 = uVar11 - 1;
          if ((bVar1 & 1) != 0) {
            if (uVar11 < 5) goto LAB_0010b06a;
            zip_entry->mtime = (ulong)*(uint *)(p + uVar19);
            uVar19 = uVar6 + 9;
            uVar15 = uVar14 - 5;
          }
          if ((bVar1 & 2) != 0) {
            if ((ushort)uVar15 < 4) goto LAB_0010b06a;
            zip_entry->atime = (ulong)*(uint *)(p + uVar19);
            uVar19 = uVar19 + 4;
            uVar15 = uVar15 - 4;
          }
          if (((bVar1 & 4) != 0) && (3 < (ushort)uVar15)) {
            zip_entry->ctime = (ulong)*(uint *)(p + uVar19);
            uVar19 = uVar19 + 4;
            uVar15 = uVar15 - 4;
          }
        }
        else if (sVar3 == 0x5855) {
          if (7 < uVar11) {
            zip_entry->atime = (ulong)*(uint *)(p + uVar10);
            zip_entry->mtime = (ulong)*(uint *)(p + uVar10 + 4);
            if (0xb < uVar11) {
              zip_entry->uid = (ulong)*(ushort *)(p + uVar10 + 8);
              uVar10 = (ulong)*(ushort *)(p + uVar10 + 10);
              goto LAB_0010aff0;
            }
          }
        }
        else if (sVar3 == 0x6c78) {
          iVar16 = 0;
          if (uVar11 == 0) {
LAB_0010b041:
            uVar15 = 0;
          }
          else {
            bVar1 = p[uVar10];
            bVar2 = bVar1;
            for (; (0x7f < bVar2 && ((ushort)(uVar11 - 1) != (short)iVar16)); iVar16 = iVar16 + 1) {
              bVar2 = p[uVar6 + iVar16 + 5];
            }
            iVar12 = (uint)uVar11 - iVar16;
            uVar15 = iVar12 + 0xffff;
            uVar19 = uVar6 + iVar16 + 5;
            if ((bVar1 & 1) != 0) {
              if ((ushort)iVar12 < 3) goto LAB_0010b06a;
              zip_entry->system = p[(ulong)uVar19 + 1];
              uVar19 = uVar6 + iVar16 + 7;
              uVar15 = iVar12 - 3;
            }
            if ((bVar1 & 2) != 0) {
              if ((ushort)uVar15 < 2) goto LAB_0010b06a;
              uVar19 = uVar19 + 2;
              uVar15 = uVar15 - 2;
            }
            if ((bVar1 & 4) != 0) {
              if ((ushort)uVar15 < 4) goto LAB_0010b06a;
              uVar6 = *(uint *)(p + uVar19);
              if (zip_entry->system == '\0') {
                uVar11 = 0x41fd;
                if ((uVar6 & 0x10) == 0) {
                  uVar11 = 0x81b4;
                }
                zip_entry->mode = uVar11;
                if ((uVar6 & 1) != 0) {
                  uVar11 = uVar11 & 0x16d;
                  goto LAB_0010b1e4;
                }
              }
              else {
                if (zip_entry->system == '\x03') {
                  uVar11 = (ushort)(uVar6 >> 0x10);
                }
                else {
                  uVar11 = 0;
                }
LAB_0010b1e4:
                zip_entry->mode = uVar11;
              }
              uVar19 = uVar19 + 4;
              uVar15 = uVar15 - 4;
            }
            if (((bVar1 & 8) != 0) && (1 < (ushort)uVar15)) {
              uVar11 = *(ushort *)(p + uVar19);
              uVar19 = uVar19 + 2;
              uVar15 = uVar15 - 2;
              if (uVar11 <= (ushort)uVar15) {
                uVar19 = uVar19 + uVar11;
                uVar15 = uVar15 - uVar11;
              }
            }
          }
        }
        else if (sVar3 == 0x7075) {
          if ((entry != (archive_entry *)0x0) && (4 < uVar11)) {
            uVar19 = uVar6 + 9;
            uVar15 = uVar14 - 5;
            if (*(long *)((long)pvVar4 + 0x1ee0) == 0) {
              paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
              *(archive_string_conv **)((long)pvVar4 + 0x1ee0) = paVar8;
              if (paVar8 == (archive_string_conv *)0x0) goto LAB_0010b06a;
            }
            if ((*(char *)((long)pvVar4 + 0xa0) == '\0') &&
               (pcVar13 = archive_entry_pathname(entry), pcVar13 != (char *)0x0)) {
              pcVar5 = *(code **)((long)pvVar4 + 0x98);
              sVar9 = strlen(pcVar13);
              uVar10 = (*pcVar5)(0,pcVar13,sVar9);
              if (uVar10 != *(uint *)(p + ((ulong)uVar19 - 4))) goto LAB_0010b06a;
            }
            _archive_entry_copy_pathname_l
                      (entry,p + uVar19,(ulong)uVar15 & 0xffff,
                       *(archive_string_conv **)((long)pvVar4 + 0x1ee0));
          }
        }
        else if (sVar3 == 0x7855) {
          if ((1 < uVar11) && (zip_entry->uid = (ulong)*(ushort *)(p + uVar10), 3 < uVar11)) {
            uVar10 = (ulong)*(ushort *)(p + uVar10 + 2);
            goto LAB_0010aff0;
          }
        }
        else if (sVar3 == 0x7875) {
          if (uVar11 == 0) goto LAB_0010b041;
          if (p[uVar10] == '\x01') {
            uVar14 = 0;
            if (3 < uVar11) {
              bVar1 = p[uVar6 + 5];
              uVar14 = (uint)bVar1;
              if (bVar1 == 2) {
                uVar17 = (ulong)*(ushort *)(p + uVar10 + 2);
                uVar14 = 2;
              }
              else {
                if ((uVar11 < 6) || (bVar1 != 4)) goto LAB_0010b16d;
                uVar17 = (ulong)*(uint *)(p + uVar10 + 2);
                uVar14 = 4;
              }
              zip_entry->uid = uVar17;
            }
LAB_0010b16d:
            if (uVar14 + 5 < (uint)uVar11 || uVar14 + 5 == (uint)uVar11) {
              if (p[uVar6 + uVar14 + 6] == '\x04') {
                if (uVar14 + 7 <= (uint)uVar11) {
                  uVar10 = (ulong)*(uint *)(p + (ulong)uVar14 + uVar10 + 3);
                  goto LAB_0010aff0;
                }
              }
              else if (p[uVar6 + uVar14 + 6] == '\x02') {
                uVar10 = (ulong)*(ushort *)(p + (ulong)uVar14 + uVar10 + 3);
LAB_0010aff0:
                zip_entry->gid = uVar10;
              }
            }
          }
        }
        else {
          uVar15 = (uint)uVar11;
          if (sVar3 == 1) {
            zip_entry->flags = zip_entry->flags | 1;
            uVar15 = (uint)uVar11;
            if (zip_entry->uncompressed_size == 0xffffffff) {
              if ((uVar11 < 8) || (*(long *)(p + uVar10) < 0)) {
                pcVar13 = "Malformed 64-bit uncompressed size";
                goto LAB_0010b26d;
              }
              zip_entry->uncompressed_size = *(long *)(p + uVar10);
              uVar19 = uVar6 + 0xc;
              uVar15 = uVar14 - 8;
            }
            if (zip_entry->compressed_size == 0xffffffff) {
              if (((ushort)uVar15 < 8) || (*(long *)(p + uVar19) < 0)) {
                pcVar13 = "Malformed 64-bit compressed size";
                goto LAB_0010b26d;
              }
              zip_entry->compressed_size = *(long *)(p + uVar19);
              uVar19 = uVar19 + 8;
              uVar15 = uVar15 - 8;
            }
            if (zip_entry->local_header_offset == 0xffffffff) {
              if (((ushort)uVar15 < 8) || (*(long *)(p + uVar19) < 0)) {
                pcVar13 = "Malformed 64-bit local header offset";
                goto LAB_0010b26d;
              }
              zip_entry->local_header_offset = *(long *)(p + uVar19);
              uVar19 = uVar19 + 8;
              uVar15 = uVar15 - 8;
            }
          }
        }
      }
LAB_0010b06a:
      uVar6 = (uVar15 & 0xffff) + uVar19;
    }
  }
  return wVar18;
}

Assistant:

static int
process_extra(struct archive_read *a, struct archive_entry *entry,
     const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;
	struct zip *zip = (struct zip *)(a->format->data);

	if (extra_length == 0) {
		return ARCHIVE_OK;
	}

	if (extra_length < 4) {
		size_t i = 0;
		/* Some ZIP files may have trailing 0 bytes. Let's check they
		 * are all 0 and ignore them instead of returning an error.
		 *
		 * This is not technically correct, but some ZIP files look
		 * like this and other tools support those files - so let's
		 * also  support them.
		 */
		for (; i < extra_length; i++) {
			if (p[i] != 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too-small extra data: "
				    "Need at least 4 bytes, "
				    "but only found %d bytes",
				    (int)extra_length);
				return ARCHIVE_FAILED;
			}
		}

		return ARCHIVE_OK;
	}

	while (offset <= extra_length - 4) {
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);

		offset += 4;
		if (offset + datasize > extra_length) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT, "Extra data overflow: "
			    "Need %d bytes but only found %d bytes",
			    (int)datasize, (int)(extra_length - offset));
			return ARCHIVE_FAILED;
		}
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%04x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "uncompressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->uncompressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "compressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->compressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "local header offset");
					return ARCHIVE_FAILED;
				}
				zip_entry->local_header_offset = t;
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
#ifdef DEBUG
		case 0x0017:
		{
			/* Strong encryption field. */
			if (archive_le16dec(p + offset) == 2) {
				unsigned algId =
					archive_le16dec(p + offset + 2);
				unsigned bitLen =
					archive_le16dec(p + offset + 4);
				int	 flags =
					archive_le16dec(p + offset + 6);
				fprintf(stderr, "algId=0x%04x, bitLen=%u, "
				    "flgas=%d\n", algId, bitLen,flags);
			}
			break;
		}
#endif
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags;
			if (datasize == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete extended time field");
				return ARCHIVE_FAILED;
			}
			flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c78:
		{
			/* Experimental 'xl' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes (and other
			 * fields that ordinarily appear only in
			 * central directory) in local file header.
			 * This provides file type and permission
			 * information necessary to support full
			 * streaming extraction.  Currently being
			 * discussed with other Zip developers
			 * ... subject to change.
			 *
			 * Format:
			 *  The field starts with a bitmap that specifies
			 *  which additional fields are included.  The
			 *  bitmap is variable length and can be extended in
			 *  the future.
			 *
			 *  n bytes - feature bitmap: first byte has low-order
			 *    7 bits.  If high-order bit is set, a subsequent
			 *    byte holds the next 7 bits, etc.
			 *
			 *  if bitmap & 1, 2 byte "version made by"
			 *  if bitmap & 2, 2 byte "internal file attributes"
			 *  if bitmap & 4, 4 byte "external file attributes"
			 *  if bitmap & 8, 2 byte comment length + n byte
			 *  comment
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				/* 2 byte "version made by" */
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				/* 2 byte "internal file attributes" */
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				/* Not used by libarchive at present. */
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				/* 4 byte "external file attributes" */
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				} else if (zip_entry->system == 0) {
					// Interpret MSDOS directory bit
					if (0x10 == (external_attributes &
					    0x10)) {
						zip_entry->mode =
						    AE_IFDIR | 0775;
					} else {
						zip_entry->mode =
						    AE_IFREG | 0664;
					}
					if (0x01 == (external_attributes &
					    0x01)) {
						/* Read-only bit;
						 * strip write permissions */
						zip_entry->mode &= 0555;
					}
				} else {
					zip_entry->mode = 0;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				/* 2 byte comment length + comment */
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				/* Comment is not supported by libarchive */
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7075:
		{
			/* Info-ZIP Unicode Path Extra Field. */
			if (datasize < 5 || entry == NULL)
				break;
			offset += 5;
			datasize -= 5;

			/* The path name in this field is always encoded
			 * in UTF-8. */
			if (zip->sconv_utf8 == NULL) {
				zip->sconv_utf8 =
					archive_string_conversion_from_charset(
					&a->archive, "UTF-8", 1);
				/* If the converter from UTF-8 is not
				 * available, then the path name from the main
				 * field will more likely be correct. */
				if (zip->sconv_utf8 == NULL)
					break;
			}

			/* Make sure the CRC32 of the filename matches. */
			if (!zip->ignore_crc32) {
				const char *cp = archive_entry_pathname(entry);
				if (cp) {
					unsigned long file_crc =
					    zip->crc32func(0, cp, strlen(cp));
					unsigned long utf_crc =
					    archive_le32dec(p + offset - 4);
					if (file_crc != utf_crc) {
#ifdef DEBUG
						fprintf(stderr,
						    "CRC filename mismatch; "
						    "CDE is %lx, but UTF8 "
						    "is outdated with %lx\n",
						    file_crc, utf_crc);
#endif
						break;
					}
				}
			}

			if (archive_entry_copy_pathname_l(entry,
			    p + offset, datasize, zip->sconv_utf8) != 0) {
				/* Ignore the error, and fallback to the path
				 * name from the main field. */
#ifdef DEBUG
				fprintf(stderr, "Failed to read the ZIP "
				    "0x7075 extra field path.\n");
#endif
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = 0xff & (int)p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = 0xff &
					    (int)p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		case 0x9901:
			/* WinZip AES extra data field. */
			if (datasize < 6) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete AES field");
				return ARCHIVE_FAILED;
			}
			if (p[offset + 2] == 'A' && p[offset + 3] == 'E') {
				/* Vendor version. */
				zip_entry->aes_extra.vendor =
				    archive_le16dec(p + offset);
				/* AES encryption strength. */
				zip_entry->aes_extra.strength = p[offset + 4];
				/* Actual compression method. */
				zip_entry->aes_extra.compression =
				    p[offset + 5];
			}
			break;
		default:
			break;
		}
		offset += datasize;
	}
	return ARCHIVE_OK;
}